

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextGLImpl::SetScissorRects
          (DeviceContextGLImpl *this,Uint32 NumRects,Rect *pRects,Uint32 RTWidth,Uint32 RTHeight)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  GLenum err;
  Uint32 RTHeight_local;
  string msg;
  GLenum err_1;
  Uint32 RTWidth_local;
  
  RTHeight_local = RTHeight;
  RTWidth_local = RTWidth;
  DeviceContextBase<Diligent::EngineGLImplTraits>::SetScissorRects
            (&this->super_DeviceContextBase<Diligent::EngineGLImplTraits>,NumRects,pRects,
             &RTWidth_local,&RTHeight_local);
  if ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_NumScissorRects != NumRects) {
    FormatString<char[35]>(&msg,(char (*) [35])"Unexpected number of scissor rects");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SetScissorRects",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (NumRects == 1) {
    iVar1 = (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_ScissorRects[0].bottom;
    iVar2 = (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_ScissorRects[0].left;
    glScissor(iVar2,RTHeight_local - iVar1,
              (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_ScissorRects[0].right
              - iVar2,iVar1 - (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                              m_ScissorRects[0].top);
    err = glGetError();
    if (err != 0) {
      LogError<false,char[27],char[17],unsigned_int>
                (false,"SetScissorRects",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x156,(char (*) [27])"Failed to set scissor rect",
                 (char (*) [17])"\nGL Error Code: ",&err);
      FormatString<char[6]>(&msg,(char (*) [6])0x32e52e);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"SetScissorRects",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x156);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    err = 0;
    if (NumRects != 0) {
      uVar3 = 0;
      do {
        iVar1 = (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_ScissorRects[uVar3].
                bottom;
        iVar2 = (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_ScissorRects[uVar3].
                left;
        (*__glewScissorIndexed)
                  ((GLuint)uVar3,iVar2,RTHeight_local - iVar1,
                   (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_ScissorRects
                   [uVar3].right - iVar2,
                   iVar1 - (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                           m_ScissorRects[uVar3].top);
        err_1 = glGetError();
        if (err_1 != 0) {
          LogError<false,char[29],unsigned_int,char[17],unsigned_int>
                    (false,"SetScissorRects",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                     ,0x162,(char (*) [29])"Failed to set scissor rect #",&err,
                     (char (*) [17])"\nGL Error Code: ",&err_1);
          FormatString<char[6]>(&msg,(char (*) [6])0x32e52e);
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"SetScissorRects",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                     ,0x162);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
          }
        }
        err = err + 1;
        uVar3 = (ulong)err;
      } while (err < NumRects);
    }
  }
  return;
}

Assistant:

void DeviceContextGLImpl::SetScissorRects(Uint32 NumRects, const Rect* pRects, Uint32 RTWidth, Uint32 RTHeight)
{
    TDeviceContextBase::SetScissorRects(NumRects, pRects, RTWidth, RTHeight);

    VERIFY(NumRects == m_NumScissorRects, "Unexpected number of scissor rects");
    if (NumRects == 1)
    {
        const Rect& Rect = m_ScissorRects[0];
        // Note that OpenGL and DirectX use different origin
        // of the viewport in window coordinates:
        //
        // DirectX (0,0)
        //     \ ____________
        //      |            |
        //      |            |
        //      |            |
        //      |            |
        //      |____________|
        //     /
        //  OpenGL (0,0)
        //
        int glBottom = RTHeight - Rect.bottom;

        int width  = Rect.right - Rect.left;
        int height = Rect.bottom - Rect.top;
        glScissor(Rect.left, glBottom, width, height);
        DEV_CHECK_GL_ERROR("Failed to set scissor rect");
    }
    else
    {
        for (Uint32 sr = 0; sr < NumRects; ++sr)
        {
            const Rect& Rect = m_ScissorRects[sr];

            int glBottom = RTHeight - Rect.bottom;
            int width    = Rect.right - Rect.left;
            int height   = Rect.bottom - Rect.top;
            glScissorIndexed(sr, Rect.left, glBottom, width, height);
            DEV_CHECK_GL_ERROR("Failed to set scissor rect #", sr);
        }
    }
}